

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igami.c
# Opt level: O3

double hcephes_igami(double a,double y0)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_80;
  double local_68;
  double local_58;
  double local_48;
  
  dVar8 = 1.0 / (a * 9.0);
  local_58 = 1.0;
  dVar5 = hcephes_ndtri(y0);
  local_48 = 0.0;
  if (dVar8 < 0.0) {
    dVar7 = sqrt(dVar8);
  }
  else {
    dVar7 = SQRT(dVar8);
  }
  dVar8 = (1.0 - dVar8) - dVar5 * dVar7;
  dVar8 = dVar8 * a * dVar8 * dVar8;
  dVar5 = hcephes_lgam(a);
  if (0.0 <= dVar8) {
    local_68 = 0.0;
    local_58 = 1.0;
    local_80 = INFINITY;
    uVar3 = 0;
    local_48 = 0.0;
    while ((dVar7 = hcephes_igamc(a,dVar8), local_68 <= dVar7 && (dVar7 <= local_58))) {
      dVar6 = dVar8;
      dVar1 = dVar7;
      if (y0 <= dVar7) {
        dVar6 = local_80;
        dVar1 = local_68;
        local_58 = dVar7;
      }
      local_68 = dVar1;
      local_80 = dVar6;
      local_48 = (double)((ulong)local_48 & -(ulong)(dVar7 < y0) |
                         ~-(ulong)(dVar7 < y0) & (ulong)dVar8);
      dVar6 = log(dVar8);
      dVar6 = (dVar6 * (a + -1.0) - dVar8) - dVar5;
      if (dVar6 < -709.782712893384) break;
      dVar6 = exp(dVar6);
      dVar7 = (dVar7 - y0) / -dVar6;
      if (ABS(dVar7 / dVar8) < 1.1102230246251565e-16) {
        return dVar8;
      }
      dVar8 = dVar8 - dVar7;
      if (((8 < uVar3) || (local_80 < dVar8)) || (uVar3 = uVar3 + 1, dVar8 < local_48)) break;
    }
    if (local_80 < INFINITY) goto LAB_00104841;
  }
  local_80 = (double)(~-(ulong)(0.0 < dVar8) & 0x3ff1000000000000 |
                     (ulong)(dVar8 * 1.0625) & -(ulong)(0.0 < dVar8));
  local_68 = hcephes_igamc(a,local_80);
  if (y0 <= local_68) {
    dVar5 = 0.0625;
    do {
      dVar5 = dVar5 + dVar5;
      local_80 = local_80 * (dVar5 + 1.0);
      local_68 = hcephes_igamc(a,local_80);
    } while (y0 <= local_68);
  }
LAB_00104841:
  uVar3 = 0;
  iVar4 = 400;
  dVar5 = 0.5;
  do {
    dVar7 = dVar5 * (local_80 - local_48) + local_48;
    dVar8 = hcephes_igamc(a,dVar7);
    if (((ABS((local_80 - local_48) / (local_48 + local_80)) < 5.551115123125783e-16) ||
        (dVar7 <= 0.0)) || (ABS((dVar8 - y0) / y0) < 5.551115123125783e-16)) break;
    if (y0 <= dVar8) {
      if ((int)uVar3 < 0) {
        uVar3 = 0;
        dVar6 = 0.5;
      }
      else if (uVar3 < 2) {
        dVar6 = (y0 - local_68) / (dVar8 - local_68);
      }
      else {
        dVar6 = dVar5 * 0.5 + 0.5;
      }
      uVar3 = uVar3 + 1;
      local_58 = dVar8;
      local_48 = dVar7;
    }
    else {
      dVar6 = 0.5;
      uVar2 = 0;
      if ((int)uVar3 < 1) {
        uVar2 = uVar3;
        if ((int)uVar3 < -1) {
          dVar6 = dVar5 * 0.5;
        }
        else {
          dVar6 = (y0 - dVar8) / (local_58 - dVar8);
        }
      }
      uVar3 = uVar2 - 1;
      local_80 = dVar7;
      local_68 = dVar8;
    }
    iVar4 = iVar4 + -1;
    dVar5 = dVar6;
  } while (iVar4 != 0);
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    hcephes_mtherr("igami",4);
  }
  return dVar7;
}

Assistant:

HCEPHES_API double hcephes_igami(double a, double y0) {
    double x0, x1, x, yl, yh, y, d, lgm, dithresh;
    int i, dir;

    /* bound the solution */
    x0 = HUGE_VAL;
    yl = 0;
    x1 = 0;
    yh = 1.0;
    dithresh = 5.0 * HCEPHES_MACHEP;

    /* approximation to inverse function */
    d = 1.0 / (9.0 * a);
    y = (1.0 - d - hcephes_ndtri(y0) * sqrt(d));
    x = a * y * y * y;

    lgm = hcephes_lgam(a);

    for (i = 0; i < 10; i++) {
        if (x > x0 || x < x1)
            goto ihalve;
        y = hcephes_igamc(a, x);
        if (y < yl || y > yh)
            goto ihalve;
        if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        /* compute the derivative of the function at this point */
        d = (a - 1.0) * log(x) - x - lgm;
        if (d < -HCEPHES_MAXLOG)
            goto ihalve;
        d = -exp(d);
        /* compute the step to the next approximation of x */
        d = (y - y0) / d;
        if (fabs(d / x) < HCEPHES_MACHEP)
            goto done;
        x = x - d;
    }

/* Resort to interval halving if Newton iteration did not converge. */
ihalve:

    d = 0.0625;
    if (x0 == HUGE_VAL) {
        if (x <= 0.0)
            x = 1.0;
        while (x0 == HUGE_VAL) {
            x = (1.0 + d) * x;
            y = hcephes_igamc(a, x);
            if (y < y0) {
                x0 = x;
                yl = y;
                break;
            }
            d = d + d;
        }
    }
    d = 0.5;
    dir = 0;

    for (i = 0; i < 400; i++) {
        x = x1 + d * (x0 - x1);
        y = hcephes_igamc(a, x);
        lgm = (x0 - x1) / (x1 + x0);
        if (fabs(lgm) < dithresh)
            break;
        lgm = (y - y0) / y0;
        if (fabs(lgm) < dithresh)
            break;
        if (x <= 0.0)
            break;
        if (y >= y0) {
            x1 = x;
            yh = y;
            if (dir < 0) {
                dir = 0;
                d = 0.5;
            } else if (dir > 1)
                d = 0.5 * d + 0.5;
            else
                d = (y0 - yl) / (yh - yl);
            dir += 1;
        } else {
            x0 = x;
            yl = y;
            if (dir > 0) {
                dir = 0;
                d = 0.5;
            } else if (dir < -1)
                d = 0.5 * d;
            else
                d = (y0 - yl) / (yh - yl);
            dir -= 1;
        }
    }
    if (x == 0.0)
        hcephes_mtherr("igami", HCEPHES_UNDERFLOW);

done:
    return (x);
}